

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

Reference * __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<TestNLHandler>>
::ReadReference_abi_cxx11_
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
           *this)

{
  char cVar1;
  undefined8 *in_RSI;
  Reference *in_RDI;
  CStringRef unaff_retaddr;
  BasicCStringRef<char> in_stack_ffffffffffffffe8;
  Reference *this_00;
  
  this_00 = in_RDI;
  cVar1 = ReaderBase::ReadChar((ReaderBase *)*in_RSI);
  if (cVar1 != 'v') {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffffe8,"expected reference");
    BinaryReaderBase::ReportError<>((BinaryReaderBase *)this_00,unaff_retaddr);
  }
  DoReadReference_abi_cxx11_
            ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<TestNLHandler>_>
              *)in_stack_ffffffffffffffe8.data_);
  return in_RDI;
}

Assistant:

Reference ReadReference() {
    if (reader_.ReadChar() != 'v')
      reader_.ReportError("expected reference");
    return DoReadReference();
  }